

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinitionUtil.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_3::collectNamedStructureDefinitions
               (vector<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_> *dst,
               VarType *type)

{
  VarType *pVVar1;
  pointer ppSVar2;
  char *a;
  deBool dVar3;
  long lVar4;
  pointer pSVar5;
  pointer ppSVar6;
  pointer ppSVar7;
  long lVar8;
  StructType *local_38;
  
  for (; type->m_type == TYPE_ARRAY; type = (type->m_data).array.elementType) {
  }
  if (type->m_type != TYPE_STRUCT) {
    return;
  }
  pVVar1 = (type->m_data).array.elementType;
  if ((pVVar1->m_data).array.elementType == (VarType *)0x0) goto LAB_016d6df4;
  ppSVar6 = (dst->
            super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppSVar2 = (dst->
            super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  a = *(char **)pVVar1;
  lVar4 = (long)ppSVar2 - (long)ppSVar6 >> 5;
  if (0 < lVar4) {
    lVar4 = lVar4 + 1;
    ppSVar6 = ppSVar6 + 2;
    do {
      ppSVar7 = ppSVar6;
      if (((ppSVar7[-2]->m_typeName)._M_string_length != 0) &&
         (dVar3 = deStringEqual(a,(ppSVar7[-2]->m_typeName)._M_dataplus._M_p), dVar3 == 1)) {
        ppSVar7 = ppSVar7 + -2;
        goto LAB_016d6dee;
      }
      if (((ppSVar7[-1]->m_typeName)._M_string_length != 0) &&
         (dVar3 = deStringEqual(a,(ppSVar7[-1]->m_typeName)._M_dataplus._M_p), dVar3 == 1)) {
        ppSVar7 = ppSVar7 + -1;
        goto LAB_016d6dee;
      }
      if ((((*ppSVar7)->m_typeName)._M_string_length != 0) &&
         (dVar3 = deStringEqual(a,((*ppSVar7)->m_typeName)._M_dataplus._M_p), dVar3 == 1))
      goto LAB_016d6dee;
      if (((ppSVar7[1]->m_typeName)._M_string_length != 0) &&
         (dVar3 = deStringEqual(a,(ppSVar7[1]->m_typeName)._M_dataplus._M_p), dVar3 == 1)) {
        ppSVar7 = ppSVar7 + 1;
        goto LAB_016d6dee;
      }
      lVar4 = lVar4 + -1;
      ppSVar6 = ppSVar7 + 4;
    } while (1 < lVar4);
    ppSVar6 = ppSVar7 + 2;
  }
  lVar4 = (long)ppSVar2 - (long)ppSVar6 >> 3;
  if (lVar4 == 1) {
LAB_016d6dba:
    ppSVar7 = ppSVar2;
    if ((((*ppSVar6)->m_typeName)._M_string_length != 0) &&
       (dVar3 = deStringEqual(a,((*ppSVar6)->m_typeName)._M_dataplus._M_p), ppSVar7 = ppSVar6,
       dVar3 != 1)) {
      ppSVar7 = ppSVar2;
    }
  }
  else if (lVar4 == 2) {
LAB_016d6d9b:
    if ((((*ppSVar6)->m_typeName)._M_string_length == 0) ||
       (dVar3 = deStringEqual(a,((*ppSVar6)->m_typeName)._M_dataplus._M_p), ppSVar7 = ppSVar6,
       dVar3 != 1)) {
      ppSVar6 = ppSVar6 + 1;
      goto LAB_016d6dba;
    }
  }
  else {
    ppSVar7 = ppSVar2;
    if ((lVar4 == 3) &&
       ((((*ppSVar6)->m_typeName)._M_string_length == 0 ||
        (dVar3 = deStringEqual(a,((*ppSVar6)->m_typeName)._M_dataplus._M_p), ppSVar7 = ppSVar6,
        dVar3 != 1)))) {
      ppSVar6 = ppSVar6 + 1;
      goto LAB_016d6d9b;
    }
  }
LAB_016d6dee:
  if (ppSVar7 !=
      (dst->super__Vector_base<const_glu::StructType_*,_std::allocator<const_glu::StructType_*>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    return;
  }
LAB_016d6df4:
  local_38 = (type->m_data).structPtr;
  pSVar5 = (local_38->m_members).
           super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(local_38->m_members).
                              super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5) >> 3) *
          -0x49249249) {
    lVar8 = 0x20;
    lVar4 = 0;
    do {
      collectNamedStructureDefinitions
                (dst,(VarType *)((long)&(pSVar5->m_name)._M_dataplus._M_p + lVar8));
      lVar4 = lVar4 + 1;
      local_38 = (type->m_data).structPtr;
      pSVar5 = (local_38->m_members).
               super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0x38;
    } while (lVar4 < (int)((ulong)((long)(local_38->m_members).
                                         super__Vector_base<glu::StructMember,_std::allocator<glu::StructMember>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar5)
                          >> 3) * -0x49249249);
  }
  std::vector<glu::StructType_const*,std::allocator<glu::StructType_const*>>::
  emplace_back<glu::StructType_const*>
            ((vector<glu::StructType_const*,std::allocator<glu::StructType_const*>> *)dst,&local_38)
  ;
  return;
}

Assistant:

static void collectNamedStructureDefinitions (std::vector<const glu::StructType*>& dst, const glu::VarType& type)
{
	if (type.isBasicType())
		return;
	else if (type.isArrayType())
		return collectNamedStructureDefinitions(dst, type.getElementType());
	else if (type.isStructType())
	{
		if (type.getStructPtr()->hasTypeName())
		{
			// must be unique (may share the the same struct)
			std::vector<const glu::StructType*>::iterator where = std::find_if(dst.begin(), dst.end(), StructNameEqualPredicate(type.getStructPtr()->getTypeName()));
			if (where != dst.end())
			{
				DE_ASSERT(**where == *type.getStructPtr());

				// identical type has been added already, types of members must be added too
				return;
			}
		}

		// Add types of members first
		for (int ndx = 0; ndx < type.getStructPtr()->getNumMembers(); ++ndx)
			collectNamedStructureDefinitions(dst, type.getStructPtr()->getMember(ndx).getType());

		dst.push_back(type.getStructPtr());
	}
	else
		DE_ASSERT(false);
}